

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Meteomatics_Internals.h
# Opt level: O1

void __thiscall
MeteomaticsApiClient::MeteomaticsApiClient
          (MeteomaticsApiClient *this,string *user,string *password,int timeout_seconds)

{
  HttpClient *this_00;
  string local_50;
  
  this_00 = (HttpClient *)operator_new(0x60);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"api.meteomatics.com","");
  MMIntern::HttpClient::HttpClient(this_00,&local_50,user,password);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  this->httpClient = this_00;
  this->dataRequestTimeout = timeout_seconds;
  return;
}

Assistant:

MeteomaticsApiClient::MeteomaticsApiClient(const std::string& user, const std::string& password, const int timeout_seconds)
: httpClient(new MMIntern::HttpClient("api.meteomatics.com", user, password))
, dataRequestTimeout(timeout_seconds)
{
}